

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode singlesocket(Curl_multi *multi,Curl_easy *data)

{
  curl_socket_callback p_Var1;
  connectdata *conn;
  Curl_multi *pCVar2;
  _Bool _Var3;
  uint uVar4;
  int iVar5;
  undefined8 *p;
  void *pvVar6;
  ulong uVar7;
  long *plVar8;
  curl_llist_element *pcVar9;
  int in_EDX;
  long lVar10;
  int iVar11;
  Curl_easy *data_00;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  curl_socket_t socks [5];
  int local_74;
  Curl_easy *local_70;
  curl_hash *local_68;
  int local_5c;
  Curl_multi *local_58;
  ulong local_50;
  curl_socket_t local_48 [6];
  
  local_48[0] = -1;
  local_48[1] = 0xffffffff;
  local_48[2] = 0xffffffff;
  local_48[3] = 0xffffffff;
  local_48[4] = 0xffffffff;
  local_70 = data;
  uVar4 = multi_getsock(data,local_48,in_EDX);
  local_68 = &multi->sockhash;
  uVar13 = 0;
  local_58 = multi;
  do {
    if ((uVar4 >> ((byte)uVar13 & 0x1f) & 0x10001) == 0) goto LAB_0012a5be;
    iVar11 = local_48[uVar13];
    local_74 = iVar11;
    if (iVar11 == -1) {
      p = (undefined8 *)0x0;
    }
    else {
      p = (undefined8 *)Curl_hash_pick(local_68,&local_74,4);
    }
    pCVar2 = local_58;
    bVar14 = (uVar4 >> ((uint)uVar13 & 0x1f) & 1) != 0;
    uVar12 = bVar14 + 2;
    if ((0x10000 << ((byte)uVar13 & 0x1f) & uVar4) == 0) {
      uVar12 = (uint)bVar14;
    }
    if (p == (undefined8 *)0x0) {
      local_5c = iVar11;
      if (iVar11 == -1) {
        p = (undefined8 *)0x0;
        local_74 = iVar11;
      }
      else {
        local_74 = iVar11;
        p = (undefined8 *)Curl_hash_pick(local_68,&local_74,4);
      }
      if (p == (undefined8 *)0x0) {
        p = (undefined8 *)(*Curl_ccalloc)(1,0x18);
        if (p != (undefined8 *)0x0) {
          *p = local_70;
          *(int *)((long)p + 0xc) = local_5c;
          pvVar6 = Curl_hash_add(local_68,&local_5c,4,p);
          if (pvVar6 != (void *)0x0) goto LAB_0012a56c;
          (*Curl_cfree)(p);
        }
        p = (undefined8 *)0x0;
      }
LAB_0012a56c:
      if (p != (undefined8 *)0x0) goto LAB_0012a571;
      iVar5 = 1;
    }
    else {
      iVar5 = 7;
      if (*(uint *)(p + 1) != uVar12) {
LAB_0012a571:
        p_Var1 = pCVar2->socket_cb;
        if (p_Var1 != (curl_socket_callback)0x0) {
          (*p_Var1)(local_70,iVar11,uVar12,pCVar2->socket_userp,(void *)p[2]);
        }
        *(uint *)(p + 1) = uVar12;
        iVar5 = 0;
      }
    }
    if ((iVar5 != 7) && (iVar5 != 0)) {
      return CURLM_OUT_OF_MEMORY;
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 5);
  uVar13 = 5;
LAB_0012a5be:
  data_00 = local_70;
  if (0 < local_70->numsocks) {
    lVar10 = 0;
    do {
      iVar11 = data_00->sockets[lVar10];
      if ((int)uVar13 != 0) {
        uVar7 = 0;
        do {
          if (iVar11 == local_48[uVar7]) {
            iVar11 = -1;
            break;
          }
          uVar7 = uVar7 + 1;
        } while ((uVar13 & 0xffffffff) != uVar7);
      }
      local_74 = iVar11;
      if (iVar11 == -1) {
        plVar8 = (long *)0x0;
      }
      else {
        plVar8 = (long *)Curl_hash_pick(local_68,&local_74,4);
        data_00 = local_70;
      }
      if (plVar8 != (long *)0x0) {
        conn = data_00->easy_conn;
        if (conn == (connectdata *)0x0) {
LAB_0012a6a7:
          if (local_58->socket_cb != (curl_socket_callback)0x0) {
            (*local_58->socket_cb)(local_70,iVar11,4,local_58->socket_userp,(void *)plVar8[2]);
          }
          local_74 = iVar11;
          Curl_hash_delete(local_68,&local_74,4);
          data_00 = local_70;
        }
        else {
          uVar7 = (conn->recv_pipe).size;
          if ((1 < uVar7) && ((Curl_easy *)*plVar8 == data_00)) {
            local_50 = uVar7;
            _Var3 = Curl_recvpipe_head(data_00,conn);
            pcVar9 = (conn->recv_pipe).head;
            if (_Var3) {
              pcVar9 = pcVar9->next;
            }
            *plVar8 = (long)pcVar9->ptr;
            uVar7 = local_50;
            data_00 = local_70;
          }
          if ((conn->send_pipe).size < 2) {
            if (uVar7 < 2) goto LAB_0012a6a7;
          }
          else if ((Curl_easy *)*plVar8 == data_00) {
            _Var3 = Curl_sendpipe_head(data_00,conn);
            pcVar9 = (conn->send_pipe).head;
            if (_Var3) {
              pvVar6 = pcVar9->next->ptr;
            }
            else {
              pvVar6 = pcVar9->ptr;
            }
            *plVar8 = (long)pvVar6;
            data_00 = local_70;
          }
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < data_00->numsocks);
  }
  memcpy(data_00->sockets,local_48,(uVar13 & 0xffffffff) << 2);
  data_00->numsocks = (int)uVar13;
  return CURLM_OK;
}

Assistant:

static CURLMcode singlesocket(struct Curl_multi *multi,
                              struct Curl_easy *data)
{
  curl_socket_t socks[MAX_SOCKSPEREASYHANDLE];
  int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int num;
  unsigned int curraction;

  for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++)
    socks[i] = CURL_SOCKET_BAD;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  curraction = multi_getsock(data, socks, MAX_SOCKSPEREASYHANDLE);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; (i< MAX_SOCKSPEREASYHANDLE) &&
        (curraction & (GETSOCK_READSOCK(i) | GETSOCK_WRITESOCK(i)));
      i++) {
    int action = CURL_POLL_NONE;

    s = socks[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);

    if(curraction & GETSOCK_READSOCK(i))
      action |= CURL_POLL_IN;
    if(curraction & GETSOCK_WRITESOCK(i))
      action |= CURL_POLL_OUT;

    if(entry) {
      /* yeps, already present so check if it has the same action set */
      if(entry->action == action)
        /* same, continue */
        continue;
    }
    else {
      /* this is a socket we didn't have before, add it! */
      entry = sh_addentry(&multi->sockhash, s, data);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }

    /* we know (entry != NULL) at this point, see the logic above */
    if(multi->socket_cb)
      multi->socket_cb(data,
                       s,
                       action,
                       multi->socket_userp,
                       entry->socketp);

    entry->action = action; /* store the current action state */
  }

  num = i; /* number of sockets */

  /* when we've walked over all the sockets we should have right now, we must
     make sure to detect sockets that are removed */
  for(i = 0; i< data->numsocks; i++) {
    int j;
    s = data->sockets[i];
    for(j = 0; j<num; j++) {
      if(s == socks[j]) {
        /* this is still supervised */
        s = CURL_SOCKET_BAD;
        break;
      }
    }

    entry = sh_getentry(&multi->sockhash, s);
    if(entry) {
      /* this socket has been removed. Tell the app to remove it */
      bool remove_sock_from_hash = TRUE;

      /* check if the socket to be removed serves a connection which has
         other easy-s in a pipeline. In this case the socket should not be
         removed. */
      struct connectdata *easy_conn = data->easy_conn;
      if(easy_conn) {
        if(easy_conn->recv_pipe.size > 1) {
          /* the handle should not be removed from the pipe yet */
          remove_sock_from_hash = FALSE;

          /* Update the sockhash entry to instead point to the next in line
             for the recv_pipe, or the first (in case this particular easy
             isn't already) */
          if(entry->easy == data) {
            if(Curl_recvpipe_head(data, easy_conn))
              entry->easy = easy_conn->recv_pipe.head->next->ptr;
            else
              entry->easy = easy_conn->recv_pipe.head->ptr;
          }
        }
        if(easy_conn->send_pipe.size > 1) {
          /* the handle should not be removed from the pipe yet */
          remove_sock_from_hash = FALSE;

          /* Update the sockhash entry to instead point to the next in line
             for the send_pipe, or the first (in case this particular easy
             isn't already) */
          if(entry->easy == data) {
            if(Curl_sendpipe_head(data, easy_conn))
              entry->easy = easy_conn->send_pipe.head->next->ptr;
            else
              entry->easy = easy_conn->send_pipe.head->ptr;
          }
        }
        /* Don't worry about overwriting recv_pipe head with send_pipe_head,
           when action will be asked on the socket (see multi_socket()), the
           head of the correct pipe will be taken according to the
           action. */
      }

      if(remove_sock_from_hash) {
        /* in this case 'entry' is always non-NULL */
        if(multi->socket_cb)
          multi->socket_cb(data,
                           s,
                           CURL_POLL_REMOVE,
                           multi->socket_userp,
                           entry->socketp);
        sh_delentry(&multi->sockhash, s);
      }
    } /* if sockhash entry existed */
  } /* for loop over numsocks */

  memcpy(data->sockets, socks, num*sizeof(curl_socket_t));
  data->numsocks = num;
  return CURLM_OK;
}